

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderCopyWindowSettings(char *src_name,char *dst_name)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2ih local_3c;
  ImVec2ih local_38;
  ImVec2ih local_34;
  ImGuiWindowSettings *pIStack_30;
  ImVec2ih window_pos_2ih;
  ImGuiWindowSettings *dst_settings;
  ImGuiWindow *dst_window;
  ImGuiWindow *src_window;
  char *dst_name_local;
  char *src_name_local;
  
  pIVar1 = FindWindowByName(src_name);
  if (pIVar1 != (ImGuiWindow *)0x0) {
    pIVar2 = FindWindowByName(dst_name);
    if (pIVar2 == (ImGuiWindow *)0x0) {
      pIStack_30 = FindOrCreateWindowSettings(dst_name);
      if (pIStack_30 != (ImGuiWindowSettings *)0x0) {
        ImVec2ih::ImVec2ih(&local_34,&pIVar1->Pos);
        if ((pIVar1->ViewportId == 0) || (pIVar1->ViewportId == 0x11111111)) {
          pIStack_30->Pos = local_34;
        }
        else {
          pIStack_30->ViewportPos = local_34;
          pIStack_30->ViewportId = pIVar1->ViewportId;
          ImVec2ih::ImVec2ih(&local_38,0,0);
          pIStack_30->Pos = local_38;
        }
        ImVec2ih::ImVec2ih(&local_3c,&pIVar1->SizeFull);
        pIStack_30->Size = local_3c;
        pIStack_30->Collapsed = (bool)(pIVar1->Collapsed & 1);
      }
    }
    else {
      pIVar2->Pos = pIVar1->Pos;
      pIVar2->Size = pIVar1->Size;
      pIVar2->SizeFull = pIVar1->SizeFull;
      pIVar2->Collapsed = (bool)(pIVar1->Collapsed & 1);
    }
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyWindowSettings(const char* src_name, const char* dst_name)
{
    ImGuiWindow* src_window = FindWindowByName(src_name);
    if (src_window == NULL)
        return;
    if (ImGuiWindow* dst_window = FindWindowByName(dst_name))
    {
        dst_window->Pos = src_window->Pos;
        dst_window->Size = src_window->Size;
        dst_window->SizeFull = src_window->SizeFull;
        dst_window->Collapsed = src_window->Collapsed;
    }
    else if (ImGuiWindowSettings* dst_settings = FindOrCreateWindowSettings(dst_name))
    {
        ImVec2ih window_pos_2ih = ImVec2ih(src_window->Pos);
        if (src_window->ViewportId != 0 && src_window->ViewportId != IMGUI_VIEWPORT_DEFAULT_ID)
        {
            dst_settings->ViewportPos = window_pos_2ih;
            dst_settings->ViewportId = src_window->ViewportId;
            dst_settings->Pos = ImVec2ih(0, 0);
        }
        else
        {
            dst_settings->Pos = window_pos_2ih;
        }
        dst_settings->Size = ImVec2ih(src_window->SizeFull);
        dst_settings->Collapsed = src_window->Collapsed;
    }
}